

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlUnicodeString.cpp
# Opt level: O1

UTFstring * __thiscall libebml::UTFstring::operator=(UTFstring *this,wchar_t _aChar)

{
  wchar_t *pwVar1;
  
  if (this->_Data != (wchar_t *)0x0) {
    operator_delete__(this->_Data);
  }
  pwVar1 = (wchar_t *)operator_new__(8);
  this->_Data = pwVar1;
  this->_Length = 1;
  *pwVar1 = _aChar;
  pwVar1[1] = L'\0';
  UpdateFromUCS2(this);
  return this;
}

Assistant:

UTFstring & UTFstring::operator=(wchar_t _aChar)
{
  delete [] _Data;
  _Data = new wchar_t[2];
  _Length = 1;
  _Data[0] = _aChar;
  _Data[1] = 0;
  UpdateFromUCS2();
  return *this;
}